

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O1

void __thiscall
level_tools::register_sector_item
          (level_tools *this,uint16_t sector_idx,char *scene_object,string *mesh)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppxVar3;
  xr_custom_object *pxVar4;
  pointer pcVar5;
  undefined6 in_register_00000032;
  ulong uVar6;
  sector_item local_78;
  
  uVar6 = CONCAT62(in_register_00000032,sector_idx) & 0xffffffff;
  ppxVar3 = (this->m_scene_sectors->
            super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (uVar6 < (ulong)((long)(this->m_scene_sectors->
                            super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppxVar3 >> 3)) {
    pxVar4 = ppxVar3[uVar6];
    paVar1 = &local_78.mesh.field_2;
    local_78.object.field_2._8_8_ = 0;
    local_78.mesh.field_2._8_8_ = 0;
    paVar2 = &local_78.object.field_2;
    local_78.object._M_string_length = 0;
    local_78.object.field_2._M_allocated_capacity = 0;
    local_78.mesh._M_string_length = 0;
    local_78.mesh.field_2._M_allocated_capacity = 0;
    local_78.object._M_dataplus._M_p = (pointer)paVar2;
    local_78.mesh._M_dataplus._M_p = (pointer)paVar1;
    std::vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>::
    emplace_back<xray_re::sector_item>
              ((vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_> *)
               &pxVar4[1].m_class_id,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.mesh._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.mesh._M_dataplus._M_p,local_78.mesh.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.object._M_dataplus._M_p != paVar2) {
      operator_delete(local_78.object._M_dataplus._M_p,
                      local_78.object.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = pxVar4[1].m_name._M_dataplus._M_p;
    make_object_ref(this,(string *)(pcVar5 + -0x40),scene_object);
    std::__cxx11::string::_M_assign((string *)(pcVar5 + -0x20));
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void level_tools::register_sector_item(uint16_t sector_idx, const char* scene_object, std::string& mesh)
{
	xr_sector_object* sector = static_cast<xr_sector_object*>(m_scene_sectors->at(sector_idx));
	sector->items().push_back(sector_item());
	sector_item* item = &sector->items().back();
	make_object_ref(item->object, scene_object);
	item->mesh = mesh;
}